

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_util.cc
# Opt level: O0

int raptor_sockaddr_to_v4mapped
              (raptor_resolved_address *resolved_addr,raptor_resolved_address *resolved_addr6_out)

{
  bool bVar1;
  raptor_sockaddr_in *addr4;
  raptor_sockaddr_in6 *addr6_out;
  raptor_sockaddr *addr;
  raptor_resolved_address *resolved_addr6_out_local;
  raptor_resolved_address *resolved_addr_local;
  
  if (resolved_addr == resolved_addr6_out) {
    raptor::LogFormatPrint
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/socket_util.cc"
               ,0x4d,kLogLevelError,"assertion failed: %s","resolved_addr != resolved_addr6_out");
    abort();
  }
  bVar1 = *(short *)resolved_addr->addr == 2;
  if (bVar1) {
    memset(resolved_addr6_out,0,0x84);
    resolved_addr6_out->addr[0] = '\n';
    resolved_addr6_out->addr[1] = '\0';
    resolved_addr6_out->addr[8] = '\0';
    resolved_addr6_out->addr[9] = '\0';
    resolved_addr6_out->addr[10] = '\0';
    resolved_addr6_out->addr[0xb] = '\0';
    resolved_addr6_out->addr[0xc] = '\0';
    resolved_addr6_out->addr[0xd] = '\0';
    resolved_addr6_out->addr[0xe] = '\0';
    resolved_addr6_out->addr[0xf] = '\0';
    resolved_addr6_out->addr[0x10] = '\0';
    resolved_addr6_out->addr[0x11] = '\0';
    resolved_addr6_out->addr[0x12] = -1;
    resolved_addr6_out->addr[0x13] = -1;
    *(undefined4 *)(resolved_addr6_out->addr + 0x14) = *(undefined4 *)(resolved_addr->addr + 4);
    *(undefined2 *)(resolved_addr6_out->addr + 2) = *(undefined2 *)(resolved_addr->addr + 2);
    resolved_addr6_out->len = 0x1c;
  }
  resolved_addr_local._4_4_ = (uint)bVar1;
  return resolved_addr_local._4_4_;
}

Assistant:

int raptor_sockaddr_to_v4mapped(const raptor_resolved_address* resolved_addr,
                                raptor_resolved_address* resolved_addr6_out) {
    RAPTOR_ASSERT(resolved_addr != resolved_addr6_out);
    const raptor_sockaddr* addr =
        reinterpret_cast<const raptor_sockaddr*>(resolved_addr->addr);
    raptor_sockaddr_in6* addr6_out =
        reinterpret_cast<raptor_sockaddr_in6*>(resolved_addr6_out->addr);
    if (addr->sa_family == AF_INET) {
        const raptor_sockaddr_in* addr4 =
            reinterpret_cast<const raptor_sockaddr_in*>(addr);
        memset(resolved_addr6_out, 0, sizeof(*resolved_addr6_out));
        addr6_out->sin6_family = AF_INET6;
        memcpy(&addr6_out->sin6_addr.s6_addr[0], kV4MappedPrefix, 12);
        memcpy(&addr6_out->sin6_addr.s6_addr[12], &addr4->sin_addr, 4);
        addr6_out->sin6_port = addr4->sin_port;
        resolved_addr6_out->len = static_cast<socklen_t>(sizeof(raptor_sockaddr_in6));
        return 1;
    }
    return 0;
}